

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::analysis::LivenessManager::GetComponentType
          (LivenessManager *this,uint32_t index,uint32_t agg_type_id)

{
  Op OVar1;
  IRContext *this_00;
  uint32_t uVar2;
  Instruction *this_01;
  uint uVar3;
  
  this_00 = this->ctx_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = DefUseManager::GetDef
                      ((this_00->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,agg_type_id);
  OVar1 = this_01->opcode_;
  if (1 < OVar1 - OpTypeVector) {
    if (OVar1 == OpTypeStruct) {
      uVar3 = (this_01->has_result_id_ & 1) + 1;
      if (this_01->has_type_id_ == false) {
        uVar3 = (uint)this_01->has_result_id_;
      }
      uVar2 = uVar3 + index;
      goto LAB_005d3cfd;
    }
    if (OVar1 != OpTypeArray) {
      __assert_fail("false && \"unexpected aggregate type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/liveness.cpp"
                    ,0x8c,
                    "uint32_t spvtools::opt::analysis::LivenessManager::GetComponentType(uint32_t, uint32_t) const"
                   );
    }
  }
  uVar2 = (this_01->has_result_id_ & 1) + 1;
  if (this_01->has_type_id_ == false) {
    uVar2 = (uint)this_01->has_result_id_;
  }
LAB_005d3cfd:
  uVar2 = Instruction::GetSingleWordOperand(this_01,uVar2);
  return uVar2;
}

Assistant:

uint32_t LivenessManager::GetComponentType(uint32_t index,
                                           uint32_t agg_type_id) const {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  Instruction* agg_type_inst = def_use_mgr->GetDef(agg_type_id);

  const uint32_t kArrayElementInIdx = 0;
  switch (agg_type_inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeVector:
      return agg_type_inst->GetSingleWordInOperand(kArrayElementInIdx);
    case spv::Op::OpTypeStruct:
      return agg_type_inst->GetSingleWordInOperand(index);
    default:
      assert(false && "unexpected aggregate type");
      return 0;
  }
}